

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::PreviousItem(ON_ComponentManifest *this,ON_UUID manifest_item_id)

{
  ON_ComponentManifestItem_PRIVATE *local_40;
  ON_ComponentManifestItem_PRIVATE *local_38;
  ON_ComponentManifestItem_PRIVATE *item;
  ON_ComponentManifest *this_local;
  ON_UUID manifest_item_id_local;
  
  manifest_item_id_local._0_8_ = manifest_item_id.Data4;
  this_local = manifest_item_id._0_8_;
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    local_38 = (ON_ComponentManifestItem_PRIVATE *)0x0;
  }
  else {
    local_38 = ON_ComponentManifestImpl::ItemFromManifestId(this->m_impl,(ON_UUID *)&this_local);
  }
  if (local_38 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    local_40 = (ON_ComponentManifestItem_PRIVATE *)0x0;
  }
  else {
    local_40 = local_38->m_prev;
  }
  return &local_40->super_ON_ComponentManifestItem;
}

Assistant:

const class ON_ComponentManifestItem* ON_ComponentManifest::PreviousItem(
  ON_UUID manifest_item_id
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromManifestId(manifest_item_id)
    : nullptr;
  return
    (nullptr != item )
    ? item->m_prev
    : nullptr;
}